

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

bool EqualsIgnoreCase(string *s1,string *s2,locale *loc)

{
  anon_class_8_1_a7c3953d __binary_pred;
  long lVar1;
  long lVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first2;
  undefined1 local_51;
  anon_class_8_1_a7c3953d compareCharLower;
  ctype<char> *ctype;
  locale *loc_local;
  string *s2_local;
  string *s1_local;
  
  __binary_pred.ctype = (ctype<char> *)std::use_facet<std::ctype<char>>(loc);
  lVar1 = std::__cxx11::string::size();
  lVar2 = std::__cxx11::string::size();
  local_51 = false;
  if (lVar1 == lVar2) {
    __first1._M_current = (char *)std::__cxx11::string::begin();
    __last1._M_current = (char *)std::__cxx11::string::end();
    __first2._M_current = (char *)std::__cxx11::string::begin();
    local_51 = std::
               equal<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,EqualsIgnoreCase(std::__cxx11::string_const&,std::__cxx11::string_const&,std::locale_const&)::_lambda(char,char)_1_>
                         (__first1,__last1,__first2,__binary_pred);
  }
  return local_51;
}

Assistant:

inline bool EqualsIgnoreCase(const std::string& s1, const std::string& s2, const std::locale& loc = std::locale()) {
    const std::ctype<char>& ctype = std::use_facet<std::ctype<char>>(loc);
    const auto compareCharLower = [&](char c1, char c2) { return ctype.tolower(c1) == ctype.tolower(c2); };
    return s1.size() == s2.size() && std::equal(s1.begin(), s1.end(), s2.begin(), compareCharLower);
}